

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

string * __thiscall duckdb::Vector::ToString(Vector *this,idx_t count)

{
  VectorType VVar1;
  LogicalType *__val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong in_RDX;
  Vector *in_RSI;
  string *in_RDI;
  idx_t i_2;
  int64_t increment;
  int64_t start;
  Value val;
  vector<unsigned_char,_true> *decompress_buffer;
  void *decoder;
  string_t compressed_string;
  idx_t i_1;
  idx_t i;
  string *retval;
  Value *in_stack_fffffffffffffc30;
  char *__rhs;
  Vector *in_stack_fffffffffffffc38;
  Vector *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  string *psVar2;
  vector<unsigned_char,_true> *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  Value *in_stack_fffffffffffffcb0;
  void *in_stack_fffffffffffffcb8;
  string local_340 [8];
  Value *in_stack_fffffffffffffcc8;
  unsigned_long local_320;
  char *local_318;
  string local_2c8 [96];
  string local_268 [32];
  string local_248 [32];
  string local_228 [96];
  vector<unsigned_char,_true> *local_1c8;
  void *local_1c0;
  anon_union_16_2_67f50693_for_value local_1b8;
  ulong local_1a0;
  string local_158 [32];
  string local_138 [32];
  ulong local_118;
  string local_110 [32];
  string local_f0 [48];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [39];
  undefined1 local_19;
  ulong local_18;
  
  local_19 = 0;
  psVar2 = in_RDI;
  local_18 = in_RDX;
  GetVectorType(in_RSI);
  VectorTypeToString((VectorType)((ulong)psVar2 >> 0x38));
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
  __val = GetType(in_RSI);
  LogicalType::ToString((LogicalType *)i_1);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
  ::std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc68);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
  ::std::__cxx11::string::~string(local_40);
  ::std::__cxx11::string::~string(local_110);
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string(local_f0);
  ::std::__cxx11::string::~string(local_a0);
  ::std::__cxx11::string::~string(local_c0);
  VVar1 = GetVectorType(in_RSI);
  switch(VVar1) {
  case FLAT_VECTOR:
  case DICTIONARY_VECTOR:
    for (local_118 = 0; local_118 < local_18; local_118 = local_118 + 1) {
      GetValue(in_stack_fffffffffffffc38,(idx_t)in_stack_fffffffffffffc30);
      Value::ToString(in_stack_fffffffffffffcc8);
      ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
      ::std::__cxx11::string::operator+=((string *)in_RDI,local_138);
      ::std::__cxx11::string::~string(local_138);
      ::std::__cxx11::string::~string(local_158);
      Value::~Value(in_stack_fffffffffffffc30);
    }
    break;
  case FSST_VECTOR:
    for (local_1a0 = 0; local_1a0 < local_18; local_1a0 = local_1a0 + 1) {
      local_1b8._0_8_ = *(undefined8 *)(in_RSI->data + local_1a0 * 0x10);
      local_1b8.pointer.ptr = (char *)*(undefined8 *)(in_RSI->data + local_1a0 * 0x10 + 8);
      local_1c0 = FSSTVector::GetDecoder((Vector *)CONCAT17(VVar1,in_stack_fffffffffffffc70));
      local_1c8 = FSSTVector::GetDecompressBuffer
                            ((Vector *)CONCAT17(VVar1,in_stack_fffffffffffffc70));
      string_t::GetData((string_t *)in_stack_fffffffffffffc30);
      string_t::GetSize((string_t *)&local_1b8.pointer);
      FSSTPrimitives::DecompressValue
                (in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
                 (idx_t)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      Value::Value(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      ::std::__cxx11::string::~string(local_228);
      GetValue(in_stack_fffffffffffffc38,(idx_t)in_stack_fffffffffffffc30);
      Value::ToString(in_stack_fffffffffffffcc8);
      ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
      ::std::__cxx11::string::operator+=((string *)in_RDI,local_248);
      ::std::__cxx11::string::~string(local_248);
      ::std::__cxx11::string::~string(local_268);
      Value::~Value(in_stack_fffffffffffffc30);
      Value::~Value(in_stack_fffffffffffffc30);
    }
    break;
  case CONSTANT_VECTOR:
    GetValue(in_stack_fffffffffffffc38,(idx_t)in_stack_fffffffffffffc30);
    Value::ToString(in_stack_fffffffffffffcc8);
    ::std::__cxx11::string::operator+=((string *)in_RDI,local_2c8);
    ::std::__cxx11::string::~string(local_2c8);
    Value::~Value(in_stack_fffffffffffffc30);
    break;
  case SEQUENCE_VECTOR:
    SequenceVector::GetSequence
              (in_stack_fffffffffffffc40,(int64_t *)in_stack_fffffffffffffc38,
               (int64_t *)in_stack_fffffffffffffc30);
    for (local_320 = 0; local_320 < local_18; local_320 = local_320 + 1) {
      __rhs = local_318;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              UnsafeNumericCast<long,_unsigned_long,_void>(local_320);
      ::std::__cxx11::to_string((long)__val);
      ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>(__lhs,__rhs);
      ::std::__cxx11::string::operator+=((string *)in_RDI,local_340);
      ::std::__cxx11::string::~string(local_340);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffca0);
    }
    break;
  default:
    ::std::__cxx11::string::operator+=((string *)in_RDI,"UNKNOWN VECTOR TYPE");
  }
  ::std::__cxx11::string::operator+=((string *)in_RDI,"]");
  return psVar2;
}

Assistant:

string Vector::ToString(idx_t count) const {
	string retval =
	    VectorTypeToString(GetVectorType()) + " " + GetType().ToString() + ": " + to_string(count) + " = [ ";
	switch (GetVectorType()) {
	case VectorType::FLAT_VECTOR:
	case VectorType::DICTIONARY_VECTOR:
		for (idx_t i = 0; i < count; i++) {
			retval += GetValue(i).ToString() + (i == count - 1 ? "" : ", ");
		}
		break;
	case VectorType::FSST_VECTOR: {
		for (idx_t i = 0; i < count; i++) {
			string_t compressed_string = reinterpret_cast<string_t *>(data)[i];
			auto decoder = FSSTVector::GetDecoder(*this);
			auto &decompress_buffer = FSSTVector::GetDecompressBuffer(*this);
			Value val = FSSTPrimitives::DecompressValue(decoder, compressed_string.GetData(),
			                                            compressed_string.GetSize(), decompress_buffer);
			retval += GetValue(i).ToString() + (i == count - 1 ? "" : ", ");
		}
	} break;
	case VectorType::CONSTANT_VECTOR:
		retval += GetValue(0).ToString();
		break;
	case VectorType::SEQUENCE_VECTOR: {
		int64_t start, increment;
		SequenceVector::GetSequence(*this, start, increment);
		for (idx_t i = 0; i < count; i++) {
			retval += to_string(start + increment * UnsafeNumericCast<int64_t>(i)) + (i == count - 1 ? "" : ", ");
		}
		break;
	}
	default:
		retval += "UNKNOWN VECTOR TYPE";
		break;
	}
	retval += "]";
	return retval;
}